

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-multiply.h
# Opt level: O0

void dynet::MatrixMultiply(Device_CPU *dev,Tensor *l,Tensor *r,Tensor *y,float *acc_scalar)

{
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  this;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_R8;
  Tensor *in_stack_00000008;
  uint b;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar1;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffe20;
  TensorCwiseUnaryOp<Eigen::internal::bind1st_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffe28;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  Scalar in_stack_fffffffffffffe3c;
  Tensor *in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe54;
  Tensor *in_stack_fffffffffffffe58;
  undefined4 local_134;
  
  uVar1 = *in_R8;
  Tensor::tbvec(in_stack_fffffffffffffe40);
  Eigen::operator*(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
  Tensor::tbvec(in_stack_fffffffffffffe40);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            (in_stack_fffffffffffffe20,(DefaultDevice *)CONCAT44(uVar1,in_stack_fffffffffffffe18));
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
               *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if ((*(int *)(in_RSI + 0x20) == 1) && (*(int *)(in_RDX + 0x20) == *(int *)(in_RCX + 0x20))) {
    Tensor::operator*(in_stack_00000008);
    Tensor::colbatch_matrix(in_stack_fffffffffffffe58);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
              (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffe30);
    Tensor::colbatch_matrix(in_stack_fffffffffffffe58);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::noalias((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)CONCAT44(uVar1,in_stack_fffffffffffffe18));
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                *)in_stack_fffffffffffffe40,
               (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  else {
    for (local_134 = 0; local_134 < *(uint *)(in_RCX + 0x20); local_134 = local_134 + 1) {
      Tensor::batch_matrix(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      Tensor::batch_matrix(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffe30);
      Tensor::batch_matrix(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      this = Eigen::
             MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
             ::noalias((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)CONCAT44(uVar1,in_stack_fffffffffffffe18));
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                    *)this.m_expression,
                   (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    }
  }
  return;
}

Assistant:

inline void MatrixMultiply(const Device_CPU & dev, const Tensor& l, const Tensor& r, Tensor& y, const float* acc_scalar) {

  y.tbvec().device(*dev.edevice) = *acc_scalar * y.tbvec();

  if(l.d.bd == 1 && r.d.bd == y.d.bd) {

      // If the left side has one batch, multiply by columns
      // [x, z, b] = [x, y] * [y, z, b]
      // -> [x, z*b] = [x, y], [y, z*b]
      y.colbatch_matrix().noalias() += *l * r.colbatch_matrix();

  } else {
    // Otherwise, loop over the batches
    DYNET_ASSERT(r.d.bd != 1 || r.d.bd != l.d.bd,
                 "Number of batch elements in matrix multiply must match, but got: " << r.d.bd << ", " << l.d.bd);

    for(unsigned b = 0; b < y.d.bd; ++b)
      y.batch_matrix(b).noalias() += l.batch_matrix(b) * r.batch_matrix(b);

  }
}